

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * GenImageGradientH(Image *__return_storage_ptr__,int width,int height,Color left,Color right)

{
  void *pvVar1;
  float fVar2;
  int local_2c;
  int j;
  float factor;
  int i;
  Color *pixels;
  int height_local;
  int width_local;
  Color right_local;
  Color left_local;
  
  pvVar1 = malloc((long)(width * height) << 2);
  for (j = 0; j < width; j = j + 1) {
    fVar2 = (float)j / (float)width;
    for (local_2c = 0; local_2c < height; local_2c = local_2c + 1) {
      *(char *)((long)pvVar1 + (long)(local_2c * width + j) * 4) =
           (char)(int)((float)((uint)right & 0xff) * fVar2 +
                      (float)((uint)left & 0xff) * (1.0 - fVar2));
      *(char *)((long)pvVar1 + (long)(local_2c * width + j) * 4 + 1) =
           (char)(int)((float)((uint)right >> 8 & 0xff) * fVar2 +
                      (float)((uint)left >> 8 & 0xff) * (1.0 - fVar2));
      *(char *)((long)pvVar1 + (long)(local_2c * width + j) * 4 + 2) =
           (char)(int)((float)((uint)right >> 0x10 & 0xff) * fVar2 +
                      (float)((uint)left >> 0x10 & 0xff) * (1.0 - fVar2));
      *(char *)((long)pvVar1 + (long)(local_2c * width + j) * 4 + 3) =
           (char)(int)((float)((uint)right >> 0x18) * fVar2 +
                      (float)((uint)left >> 0x18) * (1.0 - fVar2));
    }
  }
  __return_storage_ptr__->data = pvVar1;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientH(int width, int height, Color left, Color right)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int i = 0; i < width; i++)
    {
        float factor = (float)i/(float)width;
        for (int j = 0; j < height; j++)
        {
            pixels[j*width + i].r = (int)((float)right.r*factor + (float)left.r*(1.f - factor));
            pixels[j*width + i].g = (int)((float)right.g*factor + (float)left.g*(1.f - factor));
            pixels[j*width + i].b = (int)((float)right.b*factor + (float)left.b*(1.f - factor));
            pixels[j*width + i].a = (int)((float)right.a*factor + (float)left.a*(1.f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}